

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testEncodeRobustness(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double lat;
  uchar *b;
  double d;
  int nrTests;
  
  iVar1 = testCorrectEncode(-90.0,0.0,1);
  iVar2 = testCorrectEncode(90.0,0.0,1);
  iVar3 = testCorrectEncode(-91.0,0.0,1);
  iVar4 = testCorrectEncode(91.0,0.0,1);
  iVar5 = testCorrectEncode(0.0,-180.0,1);
  iVar6 = testCorrectEncode(0.0,180.0,1);
  iVar7 = testCorrectEncode(1.0,-181.0,1);
  iVar8 = testCorrectEncode(0.0,181.0,1);
  b._7_1_ = 0x7f;
  b._6_1_ = 0xff;
  b._5_1_ = 0xff;
  b._4_1_ = 0xff;
  b._3_1_ = 0xff;
  b._2_1_ = 0xff;
  b._1_1_ = 0xff;
  b._0_1_ = 0xff;
  iVar9 = testIncorrectEncode(0.0,(double)b,0);
  iVar10 = testIncorrectEncode((double)b,0.0,0);
  iVar11 = testIncorrectEncode((double)b,(double)b,0);
  b._7_1_ = 0x7f;
  b._6_1_ = 0xf0;
  b._5_1_ = 0;
  b._4_1_ = 0;
  b._3_1_ = 0;
  b._2_1_ = 0;
  b._1_1_ = 0;
  b._0_1_ = 0;
  iVar12 = testCorrectEncode((double)b,0.0,0);
  iVar13 = testIncorrectEncode(0.0,(double)b,0);
  iVar14 = testIncorrectEncode((double)b,(double)b,0);
  b._7_1_ = 0xff;
  b._6_1_ = 0xf0;
  b._5_1_ = 0;
  b._4_1_ = 0;
  b._3_1_ = 0;
  b._2_1_ = 0;
  b._1_1_ = 0;
  b._0_1_ = 0;
  iVar15 = testCorrectEncode((double)b,0.0,0);
  iVar16 = testIncorrectEncode(0.0,(double)b,0);
  iVar17 = testIncorrectEncode((double)b,(double)b,0);
  b._7_1_ = 0x7f;
  b._6_1_ = 0xef;
  b._5_1_ = 0xff;
  b._4_1_ = 0xff;
  b._3_1_ = 0xff;
  b._2_1_ = 0xff;
  b._1_1_ = 0xff;
  b._0_1_ = 0xff;
  iVar18 = testCorrectEncode((double)b,0.0,0);
  iVar19 = testCorrectEncode(0.0,(double)b,0);
  iVar20 = testCorrectEncode((double)b,(double)b,0);
  lat = -(double)b;
  iVar21 = testCorrectEncode(lat,0.0,0);
  iVar22 = testCorrectEncode(0.0,lat,0);
  iVar23 = testCorrectEncode(lat,lat,0);
  return iVar23 + iVar22 + iVar21 + iVar20 + iVar19 + iVar18 + iVar17 + iVar16 + iVar15 + iVar14 + 
                                                  iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 
                                                  + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + 
                                                  iVar1;
}

Assistant:

static int testEncodeRobustness(void) {
    int nrTests = 0;
    double d;
    unsigned char *b = (unsigned char *) &d;

    nrTests += testCorrectEncode(-90.0, 0.0, 1);
    nrTests += testCorrectEncode(90.0, 0.0, 1);
    nrTests += testCorrectEncode(-91.0, 0.0, 1);
    nrTests += testCorrectEncode(91.0, 0.0, 1);

    nrTests += testCorrectEncode(0.0, -180.0, 1);
    nrTests += testCorrectEncode(0.0, 180.0, 1);
    nrTests += testCorrectEncode(1.0, -181.0, 1);
    nrTests += testCorrectEncode(0.0, 181.0, 1);

    // NAN - See: https://en.wikipedia.org/wiki/Double-precision_floating-point_format
    b[7] = 0x7f;
    b[6] = 0xff;
    b[5] = 0xff;
    b[4] = 0xff;
    b[3] = 0xff;
    b[2] = 0xff;
    b[1] = 0xff;
    b[0] = 0xff;
    nrTests += testIncorrectEncode(0.0, d, 0);
    nrTests += testIncorrectEncode(d, 0.0, 0);
    nrTests += testIncorrectEncode(d, d, 0);

    // Infinity.
    b[7] = 0x7f;
    b[6] = 0xf0;
    b[5] = 0x00;
    b[4] = 0x00;
    b[3] = 0x00;
    b[2] = 0x00;
    b[1] = 0x00;
    b[0] = 0x00;
    nrTests += testCorrectEncode(d, 0.0, 0);      // Lat may be Inf.
    nrTests += testIncorrectEncode(0.0, d, 0);
    nrTests += testIncorrectEncode(d, d, 0);

    // -Infinity.
    b[7] = 0xff;
    b[6] = 0xf0;
    b[5] = 0x00;
    b[4] = 0x00;
    b[3] = 0x00;
    b[2] = 0x00;
    b[1] = 0x00;
    b[0] = 0x00;
    nrTests += testCorrectEncode(d, 0.0, 0);      // Lat may be -Inf.
    nrTests += testIncorrectEncode(0.0, d, 0);
    nrTests += testIncorrectEncode(d, d, 0);

    // Max double
    b[7] = 0x7f;
    b[6] = 0xef;
    b[5] = 0xff;
    b[4] = 0xff;
    b[3] = 0xff;
    b[2] = 0xff;
    b[1] = 0xff;
    b[0] = 0xff;
    nrTests += testCorrectEncode(d, 0.0, 0);
    nrTests += testCorrectEncode(0.0, d, 0);
    nrTests += testCorrectEncode(d, d, 0);

    d = -d;
    nrTests += testCorrectEncode(d, 0.0, 0);
    nrTests += testCorrectEncode(0.0, d, 0);
    nrTests += testCorrectEncode(d, d, 0);
    return nrTests;
}